

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void CreateBinaryTree(void)

{
  long local_1e0;
  longint d;
  FILE *file;
  longlong *parent_node;
  longlong *binary_side;
  longlong *count;
  char code [40];
  longlong lStack_188;
  longlong point [40];
  longlong local_40;
  longlong pos2;
  longlong pos1;
  longlong min2i;
  longlong min1i;
  longlong i;
  longlong b;
  longlong a;
  
  binary_side = (longlong *)calloc(vocab_size * 2 + 1,8);
  parent_node = (longlong *)calloc(vocab_size * 2 + 1,8);
  file = (FILE *)calloc(vocab_size * 2 + 1,8);
  for (b = 0; b < vocab_size; b = b + 1) {
    binary_side[b] = vocab[b].cn;
  }
  for (b = vocab_size; SBORROW8(b,vocab_size * 2) != b + vocab_size * -2 < 0; b = b + 1) {
    binary_side[b] = 1000000000000000;
  }
  pos2 = vocab_size + -1;
  local_40 = vocab_size;
  for (b = 0; b < vocab_size + -1; b = b + 1) {
    if (pos2 < 0) {
      min2i = local_40;
      local_40 = local_40 + 1;
    }
    else if (binary_side[pos2] < binary_side[local_40]) {
      min2i = pos2;
      pos2 = pos2 + -1;
    }
    else {
      min2i = local_40;
      local_40 = local_40 + 1;
    }
    if (pos2 < 0) {
      pos1 = local_40;
      local_40 = local_40 + 1;
    }
    else if (binary_side[pos2] < binary_side[local_40]) {
      pos1 = pos2;
      pos2 = pos2 + -1;
    }
    else {
      pos1 = local_40;
      local_40 = local_40 + 1;
    }
    binary_side[vocab_size + b] = binary_side[min2i] + binary_side[pos1];
    *(longlong *)(&file->_flags + min2i * 2) = vocab_size + b;
    *(longlong *)(&file->_flags + pos1 * 2) = vocab_size + b;
    parent_node[pos1] = 1;
  }
  d = (longint)fopen(output_classifier,"wb");
  for (i = 0; i < vocab_size * 2 + -2; i = i + 1) {
    if (binary == 0) {
      fprintf((FILE *)d,"%lld %lld %lld\n",i,*(undefined8 *)(&file->_flags + i * 2),parent_node[i]);
    }
    else {
      local_1e0 = (parent_node[i] * 2 + -1) * *(long *)(&file->_flags + i * 2);
      fwrite(&local_1e0,8,1,(FILE *)d);
    }
  }
  fclose((FILE *)d);
  for (b = 0; b < vocab_size; b = b + 1) {
    i = b;
    min1i = 0;
    do {
      code[min1i + -8] = (char)parent_node[i];
      point[min1i + -1] = i;
      min1i = min1i + 1;
      i = *(longlong *)(&file->_flags + i * 2);
    } while (i != vocab_size * 2 + -2);
    vocab[b].codelen = (int8_t)min1i;
    *vocab[b].point = (int)vocab_size + -2;
    for (i = 0; i < min1i; i = i + 1) {
      vocab[b].code[(min1i - i) + -1] = code[i + -8];
      vocab[b].point[min1i - i] = (int)point[i + -1] - (int)vocab_size;
    }
  }
  free(binary_side);
  free(parent_node);
  free(file);
  return;
}

Assistant:

void CreateBinaryTree() {
  long long a, b, i, min1i, min2i, pos1, pos2, point[MAX_CODE_LENGTH];
  char code[MAX_CODE_LENGTH];
  long long *count = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *binary_side = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *parent_node = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  for (a = 0; a < vocab_size; a++) count[a] = vocab[a].cn;
  for (a = vocab_size; a < vocab_size * 2; a++) count[a] = 1e15;
  pos1 = vocab_size - 1;
  pos2 = vocab_size;
  // Following algorithm constructs the Huffman tree by adding one node at a time
  for (a = 0; a < vocab_size - 1; a++) {
    // First, find two smallest nodes 'min1, min2'
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min1i = pos1;
        pos1--;
      } else {
        min1i = pos2;
        pos2++;
      }
    } else {
      min1i = pos2;
      pos2++;
    }
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min2i = pos1;
        pos1--;
      } else {
        min2i = pos2;
        pos2++;
      }
    } else {
      min2i = pos2;
      pos2++;
    }
    count[vocab_size + a] = count[min1i] + count[min2i];
    parent_node[min1i] = vocab_size + a;
    parent_node[min2i] = vocab_size + a;
    binary_side[min2i] = 1;
  }
  // Outputs the tree if requested
  if (output_classifier) {
    FILE * file = fopen(output_classifier, "wb");
    // The root is not written (node vocab_size * 2 - 2)
    for (b = 0; b < vocab_size * 2 - 2; b++) {
      if (binary) {
        // In binary mode, just write the parent * sign
        // where sign is +1 or -1, depending on which child is used
        longint d = (2 * binary_side[b] - 1) * parent_node[b];
        fwrite(&d, sizeof(longint), 1,  file);
      } else fprintf(file, "%lld %lld %lld\n", b, parent_node[b], binary_side[b]);
    }
    fclose(file);
  }

  // Now assign binary_side code to each vocabulary word
  for (a = 0; a < vocab_size; a++) {
    b = a;
    i = 0;
    while (1) {
      code[i] = binary_side[b];
      point[i] = b;
      i++;
      b = parent_node[b];
      if (b == vocab_size * 2 - 2) break;
    }
    vocab[a].codelen = i;
    vocab[a].point[0] = vocab_size - 2;
    for (b = 0; b < i; b++) {
      vocab[a].code[i - b - 1] = code[b];
      vocab[a].point[i - b] = point[b] - vocab_size;
    }
  }
  free(count);
  free(binary_side);
  free(parent_node);
}